

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void mswings(monst *mtmp,obj *otemp)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  obj *otemp_local;
  monst *mtmp_local;
  
  if (((flags.verbose != '\0') &&
      (((u.uprops[0x1e].intrinsic == 0 &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) &&
     ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0 ||
       (((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)) ||
        (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
      ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
       && (((byte)u._1052_1_ >> 5 & 1) == 0)))))) {
    pcVar3 = Monnam(mtmp);
    pcVar4 = "swings";
    if ((*(ushort *)&objects[otemp->otyp].field_0x11 >> 2 & 1) != 0) {
      pcVar4 = "thrusts";
    }
    iVar2 = pronoun_gender(level,mtmp);
    pcVar1 = genders[iVar2].his;
    pcVar5 = singular(otemp,xname);
    pline("%s %s %s %s.",pcVar3,pcVar4,pcVar1,pcVar5);
  }
  return;
}

Assistant:

static void mswings(struct monst *mtmp, struct obj *otemp)
{
	if (!flags.verbose || Blind || !mon_visible(mtmp))
		return;
	pline("%s %s %s %s.", Monnam(mtmp),
	      (objects[otemp->otyp].oc_dir & PIERCE) ? "thrusts" : "swings",
	      mhis(level, mtmp), singular(otemp, xname));
}